

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iostream.cpp
# Opt level: O1

void __thiscall stdio_stream_ops_Test::TestBody(stdio_stream_ops_Test *this)

{
  basic_ostream<char,_std::char_traits<char>_> *stream;
  char *pcVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  string y;
  string x;
  stringstream sstream;
  AssertHelper AStack_218;
  internal local_210 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  basic_ostream<char,_std::char_traits<char>_> local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  pcVar2 = local_1c0.m_buffer.m_data;
  local_1c0.m_buffer.m_size = 5;
  local_1c0.m_buffer.m_data[6] = '\0';
  local_1c0.m_buffer.m_data[7] = '\0';
  local_1c0.m_buffer.m_data[8] = '\0';
  local_1c0.m_buffer.m_data[9] = '\0';
  local_1c0.m_buffer.m_data[10] = '\0';
  local_1c0.m_buffer.m_data[0xb] = '\0';
  local_1c0.m_buffer.m_data[0xc] = '\0';
  local_1c0.m_buffer.m_data[0xd] = '\0';
  local_1c0.m_buffer.m_data[0xe] = '\0';
  local_1c0.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_1c0.m_buffer.m_data,"xxxxx",6);
  local_1c0.m_buffer.m_chars = pcVar2;
  stream = ::operator<<(local_190,&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
  pcVar1 = local_1e0.m_buffer.m_data;
  local_1e0.m_buffer.m_size = 5;
  local_1e0.m_buffer.m_data[6] = '\0';
  local_1e0.m_buffer.m_data[7] = '\0';
  local_1e0.m_buffer.m_data[8] = '\0';
  local_1e0.m_buffer.m_data[9] = '\0';
  local_1e0.m_buffer.m_data[10] = '\0';
  local_1e0.m_buffer.m_data[0xb] = '\0';
  local_1e0.m_buffer.m_data[0xc] = '\0';
  local_1e0.m_buffer.m_data[0xd] = '\0';
  local_1e0.m_buffer.m_data[0xe] = '\0';
  local_1e0.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_1e0.m_buffer.m_data,"yyyyy",6);
  local_1e0.m_buffer.m_chars = pcVar1;
  ::operator<<(stream,&local_1e0);
  if ((0xf < local_1e0.m_buffer.m_size) && (local_1e0.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_1e0.m_buffer.m_chars);
  }
  if ((0xf < local_1c0.m_buffer.m_size) && (local_1c0.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_1c0.m_buffer.m_chars);
  }
  std::istream::seekg(local_1a0,0,0);
  local_1c0.m_buffer.m_size = 0;
  local_1c0.m_buffer.m_data[0] = '\0';
  local_1c0.m_buffer.m_data[1] = '\0';
  local_1c0.m_buffer.m_data[2] = '\0';
  local_1c0.m_buffer.m_data[3] = '\0';
  local_1c0.m_buffer.m_data[4] = '\0';
  local_1c0.m_buffer.m_data[5] = '\0';
  local_1c0.m_buffer.m_data[6] = '\0';
  local_1c0.m_buffer.m_data[7] = '\0';
  local_1c0.m_buffer.m_data[8] = '\0';
  local_1c0.m_buffer.m_data[9] = '\0';
  local_1c0.m_buffer.m_data[10] = '\0';
  local_1c0.m_buffer.m_data[0xb] = '\0';
  local_1c0.m_buffer.m_data[0xc] = '\0';
  local_1c0.m_buffer.m_data[0xd] = '\0';
  local_1c0.m_buffer.m_data[0xe] = '\0';
  local_1c0.m_buffer.m_data[0xf] = '\0';
  local_1e0.m_buffer.m_size = 0;
  local_1e0.m_buffer.m_data[0] = '\0';
  local_1e0.m_buffer.m_data[1] = '\0';
  local_1e0.m_buffer.m_data[2] = '\0';
  local_1e0.m_buffer.m_data[3] = '\0';
  local_1e0.m_buffer.m_data[4] = '\0';
  local_1e0.m_buffer.m_data[5] = '\0';
  local_1e0.m_buffer.m_data[6] = '\0';
  local_1e0.m_buffer.m_data[7] = '\0';
  local_1e0.m_buffer.m_data[8] = '\0';
  local_1e0.m_buffer.m_data[9] = '\0';
  local_1e0.m_buffer.m_data[10] = '\0';
  local_1e0.m_buffer.m_data[0xb] = '\0';
  local_1e0.m_buffer.m_data[0xc] = '\0';
  local_1e0.m_buffer.m_data[0xd] = '\0';
  local_1e0.m_buffer.m_data[0xe] = '\0';
  local_1e0.m_buffer.m_data[0xf] = '\0';
  local_1e0.m_buffer.m_chars = pcVar1;
  local_1c0.m_buffer.m_chars = pcVar2;
  operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1a0,&local_1c0);
  operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1a0,&local_1e0);
  pcVar2 = local_200.m_buffer.m_data;
  local_200.m_buffer.m_size = 5;
  local_200.m_buffer.m_data[6] = '\0';
  local_200.m_buffer.m_data[7] = '\0';
  local_200.m_buffer.m_data[8] = '\0';
  local_200.m_buffer.m_data[9] = '\0';
  local_200.m_buffer.m_data[10] = '\0';
  local_200.m_buffer.m_data[0xb] = '\0';
  local_200.m_buffer.m_data[0xc] = '\0';
  local_200.m_buffer.m_data[0xd] = '\0';
  local_200.m_buffer.m_data[0xe] = '\0';
  local_200.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_200.m_buffer.m_data,"xxxxx",6);
  local_200.m_buffer.m_chars = pcVar2;
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_210,"ST::string::from_validated(\"\" \"xxxxx\" \"\", sizeof(\"xxxxx\") - 1)","x",
             &local_200,&local_1c0);
  if ((0xf < local_200.m_buffer.m_size) && (local_200.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_200.m_buffer.m_chars);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_200);
    if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_208->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_iostream.cpp"
               ,0x3c,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    if (local_200.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_200.m_buffer.m_chars + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  local_200.m_buffer.m_size = 5;
  local_200.m_buffer.m_data[6] = '\0';
  local_200.m_buffer.m_data[7] = '\0';
  local_200.m_buffer.m_data[8] = '\0';
  local_200.m_buffer.m_data[9] = '\0';
  local_200.m_buffer.m_data[10] = '\0';
  local_200.m_buffer.m_data[0xb] = '\0';
  local_200.m_buffer.m_data[0xc] = '\0';
  local_200.m_buffer.m_data[0xd] = '\0';
  local_200.m_buffer.m_data[0xe] = '\0';
  local_200.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_200.m_buffer.m_data,"yyyyy",6);
  local_200.m_buffer.m_chars = pcVar2;
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_210,"ST::string::from_validated(\"\" \"yyyyy\" \"\", sizeof(\"yyyyy\") - 1)","y",
             &local_200,&local_1e0);
  if ((0xf < local_200.m_buffer.m_size) && (local_200.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_200.m_buffer.m_chars);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_200);
    if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_208->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_iostream.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    if (local_200.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_200.m_buffer.m_chars + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  if ((0xf < local_1e0.m_buffer.m_size) && (local_1e0.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_1e0.m_buffer.m_chars);
  }
  if ((0xf < local_1c0.m_buffer.m_size) && (local_1c0.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_1c0.m_buffer.m_chars);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

TEST(stdio, stream_ops)
{
    std::stringstream sstream;
    sstream << ST_LITERAL("xxxxx") << " " << ST_LITERAL("yyyyy");

    sstream.seekg(0);
    ST::string x, y;
    sstream >> x;
    sstream >> y;

    EXPECT_EQ(ST_LITERAL("xxxxx"), x);
    EXPECT_EQ(ST_LITERAL("yyyyy"), y);
}